

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O1

string * __thiscall
ShellPathNode::Evaluate
          (string *__return_storage_ptr__,ShellPathNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *param_4)

{
  bool bVar1;
  cmState *this_00;
  long *plVar2;
  size_type *psVar3;
  pointer pbVar4;
  string_view arg;
  string_view source;
  string_view separator;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listIn;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  listOut;
  cmOutputConverter converter;
  cmStateSnapshot snapshot;
  string local_160;
  string local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  char *local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  cmGeneratorExpressionContext *local_f8;
  GeneratorExpressionContent *local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  undefined1 local_b0 [32];
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  cmStateSnapshot local_48;
  
  pbVar4 = (parameters->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  arg._M_str = (pbVar4->_M_dataplus)._M_p;
  arg._M_len = pbVar4->_M_string_length;
  cmExpandedList_abi_cxx11_(&local_120,arg,false);
  if (local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_120.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_b0,content);
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_160,"\"\" is not an absolute path.","");
    reportError(context,(string *)local_b0,&local_160);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != &local_160.field_2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((cmState *)local_b0._0_8_ != (cmState *)(local_b0 + 0x10)) {
      operator_delete((void *)local_b0._0_8_,local_b0._16_8_ + 1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    cmLocalGenerator::GetStateSnapshot(&local_48,context->LG);
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_b0,&local_48);
    local_f8 = context;
    local_f0 = content;
    this_00 = cmStateSnapshot::GetState(&local_48);
    bVar1 = cmState::UseWindowsShell(this_00);
    local_108 = ":";
    if (bVar1) {
      local_108 = ";";
    }
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_c8,
              (long)local_120.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_120.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (local_120.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_120.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_100 = &__return_storage_ptr__->field_2;
      pbVar4 = local_120.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        bVar1 = cmsys::SystemTools::FileIsFullPath(pbVar4);
        if (bVar1) {
          source._M_str = (pbVar4->_M_dataplus)._M_p;
          source._M_len = pbVar4->_M_string_length;
          cmOutputConverter::ConvertDirectorySeparatorsForShell_abi_cxx11_
                    (&local_160,(cmOutputConverter *)local_b0,source);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                     &local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_160,local_f0);
          std::operator+(&local_e8,"\"",pbVar4);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_e8);
          local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
          psVar3 = (size_type *)(plVar2 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar2 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar3) {
            local_140.field_2._M_allocated_capacity = *psVar3;
            local_140.field_2._8_8_ = plVar2[3];
          }
          else {
            local_140.field_2._M_allocated_capacity = *psVar3;
            local_140._M_dataplus._M_p = (pointer)*plVar2;
          }
          local_140._M_string_length = plVar2[1];
          *plVar2 = (long)psVar3;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          reportError(local_f8,&local_160,&local_140);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_140._M_dataplus._M_p != &local_140.field_2) {
            operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_100;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        }
        if (!bVar1) goto LAB_0050ce65;
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != local_120.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    separator._M_str = local_108;
    separator._M_len = 1;
    cmJoin(__return_storage_ptr__,&local_c8,separator,(string_view)ZEXT816(0));
LAB_0050ce65:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    if (local_70._M_p != local_b0 + 0x50) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if (local_90._M_p != local_b0 + 0x30) {
      operator_delete(local_90._M_p,local_80._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* /*dagChecker*/) const override
  {
    std::vector<std::string> listIn = cmExpandedList(parameters.front());
    if (listIn.empty()) {
      reportError(context, content->GetOriginalExpression(),
                  "\"\" is not an absolute path.");
      return std::string();
    }
    cmStateSnapshot snapshot = context->LG->GetStateSnapshot();
    cmOutputConverter converter(snapshot);
    const char* separator = snapshot.GetState()->UseWindowsShell() ? ";" : ":";
    std::vector<std::string> listOut;
    listOut.reserve(listIn.size());
    for (auto const& in : listIn) {
      if (!cmSystemTools::FileIsFullPath(in)) {
        reportError(context, content->GetOriginalExpression(),
                    "\"" + in + "\" is not an absolute path.");
        return std::string();
      }
      listOut.emplace_back(converter.ConvertDirectorySeparatorsForShell(in));
    }
    return cmJoin(listOut, separator);
  }